

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool VerifyWitnessProgram
               (CScriptWitness *witness,int witversion,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *program,uint flags,
               BaseSignatureChecker *checker,ScriptError *serror,bool is_p2sh)

{
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *stack_span;
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *pSVar1;
  pointer puVar2;
  char *pcVar3;
  byte *pbVar4;
  uchar *puVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  CSHA256 *pCVar11;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *control;
  long *plVar12;
  uint uVar13;
  long lVar14;
  undefined8 uVar15;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar16;
  size_t size;
  CScript *pCVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Span<const_unsigned_char> script;
  direct_or_indirect local_168;
  uint uStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  uint256 hash_exec_script;
  undefined1 local_d8;
  undefined8 uStack_d7;
  undefined7 uStack_cf;
  undefined1 local_c8;
  undefined8 uStack_c7;
  undefined7 uStack_bf;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae [16];
  undefined1 local_9e [16];
  undefined1 local_8e;
  long local_88;
  undefined1 local_60;
  direct_or_indirect local_58;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_4_ = 0;
  local_58._20_8_ = 0;
  uStack_3c = 0;
  local_58.indirect_contents.indirect = (char *)0x0;
  local_58.indirect_contents.capacity = 0;
  local_58._12_4_ = 0;
  stack_span = (Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               (witness->stack).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
           (witness->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pSVar1 - (long)stack_span;
  pCVar17 = (CScript *)((lVar10 >> 3) * -0x5555555555555555);
  local_b0 = 0;
  local_60 = 0;
  local_d8 = SCRIPT_ERR_OK;
  uStack_d7 = 0;
  uStack_cf = 0;
  local_c8 = 0;
  uStack_c7 = 0;
  uStack_bf = 0;
  local_b8 = 0;
  uStack_b7 = 0;
  local_ae = (undefined1  [16])0x0;
  local_9e = (undefined1  [16])0x0;
  local_8e = 0;
  if (witversion == 1) {
    if ((long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x20 || is_p2sh) goto LAB_007880d7;
    if ((flags >> 0x11 & 1) == 0) {
LAB_00788123:
      bVar7 = true;
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_OK;
      }
      goto LAB_007884ff;
    }
    if (pSVar1 == stack_span) {
LAB_00788301:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY;
      }
    }
    else {
      if (((pCVar17 < (CScript *)0x2) ||
          (pcVar3 = *(char **)((long)stack_span + lVar10 + -0x18),
          pcVar3 == *(char **)((long)stack_span + lVar10 + -0x10))) || (*pcVar3 != 'P')) {
        local_af = 0;
      }
      else {
        local_118 = (undefined1  [16])0x0;
        local_128 = (undefined1  [16])0x0;
        local_138 = (undefined1  [16])0x0;
        local_148 = (undefined1  [16])0x0;
        local_168._16_4_ = 0;
        local_168._20_4_ = 0;
        local_168._24_4_ = 0;
        uStack_14c = 0;
        local_168.direct[0] = '\0';
        local_168._1_7_ = 0;
        local_168.indirect_contents.capacity = 0;
        local_168._12_4_ = 0;
        local_108 = 0;
        CSHA256::CSHA256((CSHA256 *)&local_168.indirect_contents);
        pCVar17 = (CScript *)((long)&pCVar17[-1].super_CScriptBase._size + 3);
        pCVar11 = &HashWriter::operator<<
                             ((HashWriter *)&local_168.indirect_contents,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              ((long)stack_span + (long)pCVar17 * 0x18))->ctx;
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        CSHA256::Finalize(pCVar11,(uchar *)&hash_exec_script);
        local_9e[0] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x10];
        local_9e[1] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x11];
        local_9e[2] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x12];
        local_9e[3] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x13];
        local_9e[4] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x14];
        local_9e[5] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x15];
        local_9e[6] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x16];
        local_9e[7] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x17];
        local_9e[8] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x18];
        local_9e[9] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x19];
        local_9e[10] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_9e[0xb] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_9e[0xc] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_9e[0xd] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_9e[0xe] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_9e[0xf] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_ae[0] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0];
        local_ae[1] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[1];
        local_ae[2] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[2];
        local_ae[3] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[3];
        local_ae[4] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[4];
        local_ae[5] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[5];
        local_ae[6] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[6];
        local_ae[7] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[7];
        local_ae[8] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[8];
        local_ae[9] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[9];
        local_ae[10] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[10];
        local_ae[0xb] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xb];
        local_ae[0xc] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xc];
        local_ae[0xd] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xd];
        local_ae[0xe] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xe];
        local_ae[0xf] = hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xf];
        local_af = 1;
      }
      local_b0 = 1;
      if (pCVar17 == (CScript *)0x1) {
        puVar2 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar9 = (*checker->_vptr_BaseSignatureChecker[1])
                          (checker,stack_span->m_data,stack_span->m_size - (long)stack_span->m_data,
                           puVar2,(long)(program->
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2,2
                           ,&local_d8,serror);
        if ((char)iVar9 != '\0') goto LAB_00788123;
      }
      else {
        pbVar4 = *(byte **)((long)stack_span + (long)pCVar17 * 0x18 + -0x18);
        lVar10 = *(long *)((long)stack_span + (long)pCVar17 * 0x18 + -0x10) - (long)pbVar4;
        if ((lVar10 - 0x1022U < 0xffffffffffffefff) || (((int)lVar10 - 1U & 0x1f) != 0)) {
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE;
          }
        }
        else {
          plVar12 = (long *)((long)stack_span + (long)pCVar17 * 0x18 + -0x30);
          puVar5 = (uchar *)*plVar12;
          script.m_size = *(long *)((long)stack_span + (long)pCVar17 * 0x18 + -0x28) - (long)puVar5;
          script.m_data = puVar5;
          ComputeTapleafHash((uint256 *)&local_168.indirect_contents,*pbVar4 & 0xfe,script);
          control = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ((long)stack_span + (long)pCVar17 * 0x18 + -0x18);
          uStack_d7 = CONCAT71(local_168._1_7_,local_168.direct[0]);
          uStack_c7 = CONCAT44(local_168._20_4_,local_168._16_4_);
          uStack_bf = (undefined7)CONCAT44(uStack_14c,local_168._24_4_);
          local_b8 = (undefined1)(uStack_14c >> 0x18);
          uStack_cf = (undefined7)CONCAT44(local_168._12_4_,local_168.indirect_contents.capacity);
          local_c8 = (undefined1)((uint)local_168._12_4_ >> 0x18);
          bVar7 = VerifyTaprootCommitment
                            (control,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     (program->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start,
                             (uint256 *)
                             (program->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish);
          if (!bVar7) goto LAB_007884f1;
          local_d8 = SCRIPT_ERR_UNKNOWN_ERROR;
          if ((*(control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start & 0xfe) == 0xc0) {
            prevector<28U,_unsigned_char,_unsigned_int,_int>::
            prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       &local_168.indirect_contents,(uchar *)*plVar12,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )*(uchar **)((long)stack_span + (long)pCVar17 * 0x18 + -0x28));
            if (0x1c < uStack_3c) {
              free(local_58.indirect_contents.indirect);
            }
            local_58.indirect_contents.indirect =
                 (char *)CONCAT71(local_168._1_7_,local_168.direct[0]);
            local_58._20_8_ = CONCAT44(local_168._24_4_,local_168._20_4_);
            local_58._16_4_ = local_168._16_4_;
            local_58.indirect_contents.capacity = local_168.indirect_contents.capacity;
            local_58._12_4_ = local_168._12_4_;
            uStack_3c = uStack_14c;
            local_168.direct[0] = '\0';
            local_168._1_7_ = 0;
            VectorFormatter<DefaultFormatter>::
            Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((VectorFormatter<DefaultFormatter> *)&hash_exec_script,
                       (SizeComputer *)&local_168.indirect_contents,&witness->stack);
            local_88 = CONCAT71(local_168._1_7_,local_168.direct[0]) + 0x32;
            local_8e = 1;
            bVar7 = ExecuteWitnessScript
                              (stack_span,
                               (CScript *)((long)&pCVar17[-1].super_CScriptBase._size + 2),
                               (uint)&local_58,flags,(BaseSignatureChecker *)0x3,
                               (ScriptExecutionData *)checker,(ScriptError *)&local_d8);
            goto LAB_007884ff;
          }
          if ((flags >> 0x12 & 1) == 0) goto LAB_00788123;
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION;
          }
        }
      }
    }
  }
  else {
    if (witversion == 0) {
      lVar14 = (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar14 == 0x14) {
        if (lVar10 == 0x30) {
          local_168.direct[0] = 'v';
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents
                     ,(iterator)&local_58,(uchar *)local_168.direct);
          uVar15 = local_58.indirect_contents.indirect;
          uVar13 = uStack_3c - 0x1d;
          if (uStack_3c < 0x1d) {
            uVar15 = &local_58;
            uVar13 = uStack_3c;
          }
          local_168.direct[0] = -0x57;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents
                     ,(uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar15)->
                                       indirect + (long)(int)uVar13),(uchar *)local_168.direct);
          this = &CScript::operator<<((CScript *)&local_58.indirect_contents,program)->
                  super_CScriptBase;
          uVar13 = this->_size;
          uVar6 = uVar13 - 0x1d;
          if (uVar13 < 0x1d) {
            uVar6 = uVar13;
          }
          ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                    (this->_union).indirect_contents.indirect;
          if (uVar13 < 0x1d) {
            ppVar16 = this;
          }
          local_168.direct[0] = -0x78;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    (this,(uchar *)((long)&ppVar16->_union + (long)(int)uVar6),
                     (uchar *)local_168.direct);
          uVar13 = this->_size;
          uVar6 = uVar13 - 0x1d;
          if (uVar13 < 0x1d) {
            uVar6 = uVar13;
          }
          ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                    (this->_union).indirect_contents.indirect;
          if (uVar13 < 0x1d) {
            ppVar16 = this;
          }
          local_168.direct[0] = -0x54;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    (this,(uchar *)((long)&ppVar16->_union + (long)(int)uVar6),
                     (uchar *)local_168.direct);
          bVar7 = ExecuteWitnessScript
                            (stack_span,pCVar17,(uint)&local_58,flags,(BaseSignatureChecker *)0x1,
                             (ScriptExecutionData *)checker,(ScriptError *)&local_d8);
          goto LAB_007884ff;
        }
      }
      else {
        if (lVar14 != 0x20) {
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH;
          }
          goto LAB_007884fc;
        }
        if (pSVar1 == stack_span) goto LAB_00788301;
        pCVar17 = (CScript *)((long)&pCVar17[-1].super_CScriptBase._size + 3);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_168.indirect_contents,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)((long)stack_span + (long)pCVar17 * 0x18),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)((long)stack_span + (long)pCVar17 * 0x18 + 8));
        if (0x1c < uStack_3c) {
          free(local_58.indirect_contents.indirect);
        }
        local_58.indirect_contents.indirect = (char *)CONCAT71(local_168._1_7_,local_168.direct[0]);
        local_58._20_8_ = CONCAT44(local_168._24_4_,local_168._20_4_);
        local_58._16_4_ = local_168._16_4_;
        local_58.indirect_contents.capacity = local_168.indirect_contents.capacity;
        local_58._12_4_ = local_168._12_4_;
        uStack_3c = uStack_14c;
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        CSHA256::CSHA256((CSHA256 *)&local_168.indirect_contents);
        uVar13 = uStack_3c - 0x1d;
        uVar15 = local_58.indirect_contents.indirect;
        if (uStack_3c < 0x1d) {
          uVar13 = uStack_3c;
          uVar15 = &local_58;
        }
        pCVar11 = CSHA256::Write((CSHA256 *)&local_168.indirect_contents,(uchar *)uVar15,
                                 (ulong)uVar13);
        CSHA256::Finalize(pCVar11,(uchar *)&hash_exec_script);
        puVar2 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        auVar19[0] = -(puVar2[0x10] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x10])
        ;
        auVar19[1] = -(puVar2[0x11] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x11])
        ;
        auVar19[2] = -(puVar2[0x12] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x12])
        ;
        auVar19[3] = -(puVar2[0x13] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x13])
        ;
        auVar19[4] = -(puVar2[0x14] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x14])
        ;
        auVar19[5] = -(puVar2[0x15] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x15])
        ;
        auVar19[6] = -(puVar2[0x16] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x16])
        ;
        auVar19[7] = -(puVar2[0x17] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x17])
        ;
        auVar19[8] = -(puVar2[0x18] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x18])
        ;
        auVar19[9] = -(puVar2[0x19] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x19])
        ;
        auVar19[10] = -(puVar2[0x1a] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1a]
                       );
        auVar19[0xb] = -(puVar2[0x1b] ==
                        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar19[0xc] = -(puVar2[0x1c] ==
                        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar19[0xd] = -(puVar2[0x1d] ==
                        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar19[0xe] = -(puVar2[0x1e] ==
                        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar19[0xf] = -(puVar2[0x1f] ==
                        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar18[0] = -(*puVar2 == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0]);
        auVar18[1] = -(puVar2[1] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[1]);
        auVar18[2] = -(puVar2[2] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[2]);
        auVar18[3] = -(puVar2[3] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[3]);
        auVar18[4] = -(puVar2[4] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[4]);
        auVar18[5] = -(puVar2[5] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[5]);
        auVar18[6] = -(puVar2[6] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[6]);
        auVar18[7] = -(puVar2[7] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[7]);
        auVar18[8] = -(puVar2[8] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[8]);
        auVar18[9] = -(puVar2[9] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[9]);
        auVar18[10] = -(puVar2[10] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[10]);
        auVar18[0xb] = -(puVar2[0xb] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xb])
        ;
        auVar18[0xc] = -(puVar2[0xc] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xc])
        ;
        auVar18[0xd] = -(puVar2[0xd] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xd])
        ;
        auVar18[0xe] = -(puVar2[0xe] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xe])
        ;
        auVar18[0xf] = -(puVar2[0xf] == hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xf])
        ;
        auVar18 = auVar18 & auVar19;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
          bVar7 = ExecuteWitnessScript
                            (stack_span,pCVar17,(uint)&local_58,flags,(BaseSignatureChecker *)0x1,
                             (ScriptExecutionData *)checker,(ScriptError *)&local_d8);
          goto LAB_007884ff;
        }
      }
LAB_007884f1:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH;
      }
      goto LAB_007884fc;
    }
LAB_007880d7:
    if (is_p2sh) {
      bVar7 = true;
      if ((flags >> 0xc & 1) == 0) goto LAB_007884ff;
    }
    else {
      bVar8 = CScript::IsPayToAnchor(witversion,program);
      bVar7 = true;
      if ((flags >> 0xc & 1) == 0 || bVar8) goto LAB_007884ff;
    }
    if (serror != (ScriptError *)0x0) {
      *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM;
    }
  }
LAB_007884fc:
  bVar7 = false;
LAB_007884ff:
  if (0x1c < uStack_3c) {
    free(local_58.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

static bool VerifyWitnessProgram(const CScriptWitness& witness, int witversion, const std::vector<unsigned char>& program, unsigned int flags, const BaseSignatureChecker& checker, ScriptError* serror, bool is_p2sh)
{
    CScript exec_script; //!< Actually executed script (last stack item in P2WSH; implied P2PKH script in P2WPKH; leaf script in P2TR)
    Span stack{witness.stack};
    ScriptExecutionData execdata;

    if (witversion == 0) {
        if (program.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            // BIP141 P2WSH: 32-byte witness v0 program (which encodes SHA256(script))
            if (stack.size() == 0) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
            }
            const valtype& script_bytes = SpanPopBack(stack);
            exec_script = CScript(script_bytes.begin(), script_bytes.end());
            uint256 hash_exec_script;
            CSHA256().Write(exec_script.data(), exec_script.size()).Finalize(hash_exec_script.begin());
            if (memcmp(hash_exec_script.begin(), program.data(), 32)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else if (program.size() == WITNESS_V0_KEYHASH_SIZE) {
            // BIP141 P2WPKH: 20-byte witness v0 program (which encodes Hash160(pubkey))
            if (stack.size() != 2) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH); // 2 items in witness
            }
            exec_script << OP_DUP << OP_HASH160 << program << OP_EQUALVERIFY << OP_CHECKSIG;
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else {
            return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH);
        }
    } else if (witversion == 1 && program.size() == WITNESS_V1_TAPROOT_SIZE && !is_p2sh) {
        // BIP341 Taproot: 32-byte non-P2SH witness v1 program (which encodes a P2C-tweaked pubkey)
        if (!(flags & SCRIPT_VERIFY_TAPROOT)) return set_success(serror);
        if (stack.size() == 0) return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
        if (stack.size() >= 2 && !stack.back().empty() && stack.back()[0] == ANNEX_TAG) {
            // Drop annex (this is non-standard; see IsWitnessStandard)
            const valtype& annex = SpanPopBack(stack);
            execdata.m_annex_hash = (HashWriter{} << annex).GetSHA256();
            execdata.m_annex_present = true;
        } else {
            execdata.m_annex_present = false;
        }
        execdata.m_annex_init = true;
        if (stack.size() == 1) {
            // Key path spending (stack size is 1 after removing optional annex)
            if (!checker.CheckSchnorrSignature(stack.front(), program, SigVersion::TAPROOT, execdata, serror)) {
                return false; // serror is set
            }
            return set_success(serror);
        } else {
            // Script path spending (stack size is >1 after removing optional annex)
            const valtype& control = SpanPopBack(stack);
            const valtype& script = SpanPopBack(stack);
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE || ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) {
                return set_error(serror, SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE);
            }
            execdata.m_tapleaf_hash = ComputeTapleafHash(control[0] & TAPROOT_LEAF_MASK, script);
            if (!VerifyTaprootCommitment(control, program, execdata.m_tapleaf_hash)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            execdata.m_tapleaf_hash_init = true;
            if ((control[0] & TAPROOT_LEAF_MASK) == TAPROOT_LEAF_TAPSCRIPT) {
                // Tapscript (leaf version 0xc0)
                exec_script = CScript(script.begin(), script.end());
                execdata.m_validation_weight_left = ::GetSerializeSize(witness.stack) + VALIDATION_WEIGHT_OFFSET;
                execdata.m_validation_weight_left_init = true;
                return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::TAPSCRIPT, checker, execdata, serror);
            }
            if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION) {
                return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION);
            }
            return set_success(serror);
        }
    } else if (!is_p2sh && CScript::IsPayToAnchor(witversion, program)) {
        return true;
    } else {
        if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM) {
            return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM);
        }
        // Other version/size/p2sh combinations return true for future softfork compatibility
        return true;
    }
    // There is intentionally no return statement here, to be able to use "control reaches end of non-void function" warnings to detect gaps in the logic above.
}